

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_group_scrolled_offset_begin
              (nk_context *ctx,nk_uint *x_offset,nk_uint *y_offset,char *title,nk_flags flags)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  undefined8 uVar3;
  char *local_210;
  nk_rect *c;
  nk_window *win;
  nk_window panel;
  float fStack_40;
  nk_rect bounds;
  nk_flags flags_local;
  char *title_local;
  nk_uint *y_offset_local;
  nk_uint *x_offset_local;
  nk_context *ctx_local;
  
  pnVar1 = ctx->current;
  nk_panel_alloc_space((nk_rect *)((long)&panel.parent + 4),ctx);
  pnVar2 = pnVar1->layout;
  if (((((panel.parent._4_4_ <= (pnVar2->clip).x + (pnVar2->clip).w) &&
        ((pnVar2->clip).x <= panel.parent._4_4_ + bounds.x)) &&
       (fStack_40 <= (pnVar2->clip).y + (pnVar2->clip).h)) &&
      ((pnVar2->clip).y <= fStack_40 + bounds.y)) || ((flags & 2) != 0)) {
    bounds.w = (float)flags;
    if ((pnVar1->flags & 0x800) != 0) {
      bounds.w = (float)(flags | 0x800);
    }
    nk_zero(&win,0x1a8);
    panel.name_string._56_4_ = bounds.w;
    panel.bounds.w = (float)*x_offset;
    panel.bounds.h = (float)*y_offset;
    memcpy(&panel.scrollbar.y,&pnVar1->buffer,0x40);
    panel.buffer.last = (nk_size)nk_create_panel(ctx);
    ctx->current = (nk_window *)&win;
    local_210 = title;
    if (((uint)bounds.w & 0x40) == 0) {
      local_210 = (char *)0x0;
    }
    nk_panel_begin(ctx,local_210,NK_PANEL_GROUP);
    memcpy(&pnVar1->buffer,&panel.scrollbar.y,0x40);
    uVar3 = *(undefined8 *)(panel.buffer.last + 0x44);
    (pnVar1->buffer).clip.x = (float)(int)uVar3;
    (pnVar1->buffer).clip.y = (float)(int)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(panel.buffer.last + 0x4c);
    (pnVar1->buffer).clip.w = (float)(int)uVar3;
    (pnVar1->buffer).clip.h = (float)(int)((ulong)uVar3 >> 0x20);
    *(nk_uint **)(panel.buffer.last + 0x18) = x_offset;
    *(nk_uint **)(panel.buffer.last + 0x20) = y_offset;
    *(nk_panel **)(panel.buffer.last + 0x198) = pnVar1->layout;
    pnVar1->layout = (nk_panel *)panel.buffer.last;
    ctx->current = pnVar1;
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_group_scrolled_offset_begin(struct nk_context *ctx,
    nk_uint *x_offset, nk_uint *y_offset, const char *title, nk_flags flags)
{
    struct nk_rect bounds;
    struct nk_window panel;
    struct nk_window *win;

    win = ctx->current;
    nk_panel_alloc_space(&bounds, ctx);

    {const struct nk_rect *c = &win->layout->clip;
    if (!NK_INTERSECT(c->x, c->y, c->w, c->h, bounds.x, bounds.y, bounds.w, bounds.h) &&
        !(flags & NK_WINDOW_MOVABLE)) {
        return 0;
    }}
    if (win->flags & NK_WINDOW_ROM)
        flags |= NK_WINDOW_ROM;

    /* initialize a fake window to create the layout from */
    nk_zero(&panel, sizeof(panel));
    panel.bounds = bounds;
    panel.flags = flags;
    panel.scrollbar.x = *x_offset;
    panel.scrollbar.y = *y_offset;
    panel.buffer = win->buffer;
    panel.layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = &panel;
    nk_panel_begin(ctx, (flags & NK_WINDOW_TITLE) ? title: 0, NK_PANEL_GROUP);

    win->buffer = panel.buffer;
    win->buffer.clip = panel.layout->clip;
    panel.layout->offset_x = x_offset;
    panel.layout->offset_y = y_offset;
    panel.layout->parent = win->layout;
    win->layout = panel.layout;
    ctx->current = win;
    return 1;

}